

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O3

void __thiscall Js::CompoundString::TakeOwnershipOfLastBlock(CompoundString *this)

{
  Type *addr;
  Recycler *recycler;
  code *pcVar1;
  Type TVar2;
  bool bVar3;
  char16 *pcVar4;
  undefined4 *puVar5;
  Block *pBVar6;
  Block *pBVar7;
  
  pcVar4 = JavascriptString::UnsafeGetBuffer((JavascriptString *)this);
  if (pcVar4 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x3c5,"(!IsFinalized())","!IsFinalized()");
    if (!bVar3) goto LAB_00b294b7;
    *puVar5 = 0;
  }
  if (this->ownsLastBlock == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x3c6,"(!OwnsLastBlock())","!OwnsLastBlock()");
    if (!bVar3) {
LAB_00b294b7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  addr = &this->lastBlock;
  pBVar6 = (this->lastBlock).ptr;
  if (pBVar6 != (Block *)0x0) {
    recycler = ((((this->super_LiteralString).super_JavascriptString.super_RecyclableObject.type.ptr
                 )->javascriptLibrary).ptr)->recycler;
    pBVar6 = Block::Clone(pBVar6,(this->lastBlockInfo).charLength,recycler);
    pBVar7 = Block::Chain(pBVar6,recycler);
    pBVar6 = (pBVar7->bufferOwner).ptr;
    Memory::Recycler::WBSetBit((char *)&this->lastBlockInfo);
    (this->lastBlockInfo).buffer.ptr = pBVar6 + 1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastBlockInfo);
    TVar2 = pBVar7->charCapacity;
    (this->lastBlockInfo).charLength = pBVar7->charLength;
    (this->lastBlockInfo).charCapacity = TVar2;
    this->ownsLastBlock = true;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->lastBlock).ptr = pBVar7;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    return;
  }
  pBVar6 = BlockInfo::Resize(&this->lastBlockInfo,
                             ((((this->super_LiteralString).super_JavascriptString.
                                super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->recycler)
  ;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->lastBlock).ptr = pBVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  this->ownsLastBlock = true;
  return;
}

Assistant:

void CompoundString::TakeOwnershipOfLastBlock()
    {
        Assert(!IsFinalized());
        Assert(!OwnsLastBlock());

        // Another string object owns the last block's buffer. The buffer must be copied, or another block must be chained.

        Block *const lastBlock = this->lastBlock;
        if(!lastBlock)
        {
            // There is no last block. Only the buffer was allocated, and is held in 'lastBlockInfo'. In that case it is always
            // within the threshold to resize. Resize the buffer or resize it into a new block depending on its size.
            this->lastBlock = lastBlockInfo.Resize(GetLibrary()->GetRecycler());
            ownsLastBlock = true;
            return;
        }

        // The last block is already in a chain, or is over the threshold to resize. Shallow-clone the last block (clone
        // just its metadata, while still pointing to the original buffer), and chain it to a new last block.
        Recycler *const recycler = GetLibrary()->GetRecycler();
        Block *const newLastBlock = lastBlock->Clone(LastBlockCharLength(), recycler)->Chain(recycler);
        lastBlockInfo.CopyFrom(newLastBlock);
        ownsLastBlock = true;
        this->lastBlock = newLastBlock;
    }